

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O0

QSize __thiscall DetailButton::sizeHint(DetailButton *this)

{
  QStyle *pQVar1;
  int iVar2;
  long *in_RDI;
  long in_FS_OFFSET;
  QSize sz;
  QFontMetrics fm;
  QSize ret;
  QStyleOptionButton opt;
  QWidget *in_stack_fffffffffffffeb8;
  QStyleOptionButton *this_00;
  QSize *this_01;
  QWidget *in_stack_fffffffffffffee8;
  QSize *local_a8;
  undefined1 local_a0 [24];
  undefined1 *local_88;
  QSize local_80;
  QPalettePrivate *local_78;
  undefined1 *puStack_70;
  QObject *local_68;
  undefined1 *puStack_60;
  Data *local_58;
  char16_t *pcStack_50;
  undefined1 *local_48;
  QIcon QStack_40;
  QSize local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  undefined1 *puStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::ensurePolished(in_stack_fffffffffffffee8);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_10 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_38 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_40.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_50 = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  local_68 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_78 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionButton::QStyleOptionButton((QStyleOptionButton *)0x7ac931);
  (**(code **)(*in_RDI + 0x1b8))(in_RDI,&local_78);
  this_01 = (QSize *)&DAT_aaaaaaaaaaaaaaaa;
  local_88 = &DAT_aaaaaaaaaaaaaaaa;
  QWidget::fontMetrics(in_stack_fffffffffffffeb8);
  this_00 = (QStyleOptionButton *)local_a0;
  label((DetailButton *)this_01,(DetailButtonLabel)((ulong)this_00 >> 0x20));
  QString::operator=((QString *)this_00,(QString *)in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x7ac9b3);
  iVar2 = (int)(QFontMetrics *)&local_88;
  local_a8 = this_01;
  local_a8 = (QSize *)QFontMetrics::size(iVar2,(QString *)0x800,(int)&puStack_30,(int *)0x0);
  local_80 = (QSize)this_01;
  pQVar1 = QWidget::style(in_stack_fffffffffffffeb8);
  local_80 = (QSize)(**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,0,&local_78,&local_a8,in_RDI);
  label((DetailButton *)this_01,(DetailButtonLabel)((ulong)this_00 >> 0x20));
  QString::operator=((QString *)this_00,(QString *)in_stack_fffffffffffffeb8);
  QString::~QString((QString *)0x7aca6d);
  local_a8 = (QSize *)QFontMetrics::size(iVar2,(QString *)0x800,(int)&puStack_30,(int *)0x0);
  pQVar1 = QWidget::style(in_stack_fffffffffffffeb8);
  (**(code **)(*(long *)pQVar1 + 0xe8))(pQVar1,0,&local_78,&local_a8,in_RDI);
  local_80 = QSize::expandedTo(this_01,(QSize *)this_00);
  QFontMetrics::~QFontMetrics((QFontMetrics *)&local_88);
  QStyleOptionButton::~QStyleOptionButton(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_80;
  }
  __stack_chk_fail();
}

Assistant:

QSize sizeHint() const override
    {
        ensurePolished();
        QStyleOptionButton opt;
        initStyleOption(&opt);
        const QFontMetrics fm = fontMetrics();
        opt.text = label(ShowLabel);
        QSize sz = fm.size(Qt::TextShowMnemonic, opt.text);
        QSize ret = style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this);
        opt.text = label(HideLabel);
        sz = fm.size(Qt::TextShowMnemonic, opt.text);
        ret = ret.expandedTo(style()->sizeFromContents(QStyle::CT_PushButton, &opt, sz, this));
        return ret;
    }